

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O2

Branch * __thiscall
CFG::Relooper::AddBranch(Relooper *this,Expression *ConditionInit,Expression *CodeInit)

{
  Expression *local_38;
  Expression *ConditionInit_local;
  Expression *CodeInit_local;
  __single_object branch;
  
  local_38 = ConditionInit;
  ConditionInit_local = CodeInit;
  std::make_unique<CFG::Branch,wasm::Expression*&,wasm::Expression*&>(&CodeInit_local,&local_38);
  std::
  deque<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>,std::allocator<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>>
  ::emplace_back<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>
            ((deque<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>,std::allocator<std::unique_ptr<CFG::Branch,std::default_delete<CFG::Branch>>>>
              *)&this->Branches,
             (unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&CodeInit_local);
  std::unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_>::~unique_ptr
            ((unique_ptr<CFG::Branch,_std::default_delete<CFG::Branch>_> *)&CodeInit_local);
  return (Branch *)CodeInit_local;
}

Assistant:

Branch* Relooper::AddBranch(wasm::Expression* ConditionInit,
                            wasm::Expression* CodeInit) {
  auto branch = std::make_unique<Branch>(ConditionInit, CodeInit);
  auto* branchPtr = branch.get();
  Branches.push_back(std::move(branch));
  return branchPtr;
}